

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ProducerIPCService::RegisterDataSource
          (ProducerIPCService *this,RegisterDataSourceRequest *req,
          DeferredRegisterDataSourceResponse *response)

{
  bool bVar1;
  RemoteProducer *pRVar2;
  pointer pPVar3;
  AsyncResult<perfetto::protos::gen::RegisterDataSourceResponse> local_40;
  DataSourceDescriptor *local_30;
  DataSourceDescriptor *dsd;
  RemoteProducer *producer;
  DeferredRegisterDataSourceResponse *response_local;
  RegisterDataSourceRequest *req_local;
  ProducerIPCService *this_local;
  
  producer = (RemoteProducer *)response;
  response_local = (DeferredRegisterDataSourceResponse *)req;
  req_local = (RegisterDataSourceRequest *)this;
  dsd = (DataSourceDescriptor *)GetProducerForCurrentRequest(this);
  if (dsd == (DataSourceDescriptor *)0x0) {
    perfetto::base::ignore_result<char[68]>
              ((char (*) [68])"Producer invoked RegisterDataSource() before InitializeConnection()")
    ;
    bVar1 = ipc::DeferredBase::IsBound(&response->super_DeferredBase);
    if (bVar1) {
      ipc::DeferredBase::Reject(&response->super_DeferredBase);
    }
  }
  else {
    local_30 = protos::gen::RegisterDataSourceRequest::data_source_descriptor
                         ((RegisterDataSourceRequest *)response_local);
    pRVar2 = GetProducerForCurrentRequest(this);
    pPVar3 = std::
             unique_ptr<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>_>
             ::operator->(&pRVar2->service_endpoint);
    (*pPVar3->_vptr_ProducerEndpoint[2])(pPVar3,local_30);
    bVar1 = ipc::DeferredBase::IsBound(&response->super_DeferredBase);
    if (bVar1) {
      ipc::AsyncResult<perfetto::protos::gen::RegisterDataSourceResponse>::Create();
      ipc::Deferred<perfetto::protos::gen::RegisterDataSourceResponse>::Resolve(response,&local_40);
      ipc::AsyncResult<perfetto::protos::gen::RegisterDataSourceResponse>::~AsyncResult(&local_40);
    }
  }
  return;
}

Assistant:

void ProducerIPCService::RegisterDataSource(
    const protos::gen::RegisterDataSourceRequest& req,
    DeferredRegisterDataSourceResponse response) {
  RemoteProducer* producer = GetProducerForCurrentRequest();
  if (!producer) {
    PERFETTO_DLOG(
        "Producer invoked RegisterDataSource() before InitializeConnection()");
    if (response.IsBound())
      response.Reject();
    return;
  }

  const DataSourceDescriptor& dsd = req.data_source_descriptor();
  GetProducerForCurrentRequest()->service_endpoint->RegisterDataSource(dsd);

  // RegisterDataSource doesn't expect any meaningful response.
  if (response.IsBound()) {
    response.Resolve(
        ipc::AsyncResult<protos::gen::RegisterDataSourceResponse>::Create());
  }
}